

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkMiterBm(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Vec_Ptr_t *iCurrMatch,Vec_Ptr_t *oCurrMatch)

{
  void *pvVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  Abc_Ntk_t *pNtk;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  char Buffer [1000];
  char local_418 [1000];
  
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  sprintf(local_418,"%s_%s_miter",pNtk1->pName,pNtk2->pName);
  pcVar6 = Extra_UtilStrsav(local_418);
  pNtk->pName = pcVar6;
  pAVar7 = Abc_AigConst1(pNtk);
  pAVar8 = Abc_AigConst1(pNtk1);
  (pAVar8->field_6).pCopy = pAVar7;
  pAVar7 = Abc_AigConst1(pNtk);
  pAVar8 = Abc_AigConst1(pNtk2);
  (pAVar8->field_6).pCopy = pAVar7;
  if (iCurrMatch == (Vec_Ptr_t *)0x0) {
    pVVar9 = pNtk1->vCis;
    if (0 < pVVar9->nSize) {
      lVar16 = 0;
      do {
        pvVar1 = pVVar9->pArray[lVar16];
        pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
        *(Abc_Obj_t **)((long)pvVar1 + 0x40) = pAVar7;
        if (pNtk2->vCis->nSize <= lVar16) goto LAB_002450fe;
        pAVar8 = (Abc_Obj_t *)pNtk2->vCis->pArray[lVar16];
        (pAVar8->field_6).pCopy = pAVar7;
        pcVar6 = Abc_ObjName(pAVar8);
        Abc_ObjAssignName(pAVar7,pcVar6,(char *)0x0);
        lVar16 = lVar16 + 1;
        pVVar9 = pNtk1->vCis;
      } while (lVar16 < pVVar9->nSize);
    }
  }
  else if (0 < iCurrMatch->nSize) {
    lVar16 = 0;
    do {
      pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      if ((iCurrMatch->nSize <= lVar16) ||
         (*(Abc_Obj_t **)((long)iCurrMatch->pArray[lVar16] + 0x40) = pAVar7,
         (long)iCurrMatch->nSize <= lVar16 + 1)) goto LAB_002450fe;
      pAVar8 = (Abc_Obj_t *)iCurrMatch->pArray[lVar16 + 1];
      (pAVar8->field_6).pCopy = pAVar7;
      pcVar6 = Abc_ObjName(pAVar8);
      Abc_ObjAssignName(pAVar7,pcVar6,(char *)0x0);
      lVar16 = lVar16 + 2;
    } while ((int)lVar16 < iCurrMatch->nSize);
  }
  pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
  Abc_ObjAssignName(pAVar7,"miter",(char *)0x0);
  iVar5 = Abc_NtkIsDfsOrdered(pNtk1);
  if (iVar5 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcBm.c"
                  ,0x2f3,
                  "Abc_Ntk_t *Abc_NtkMiterBm(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  pVVar9 = pNtk1->vObjs;
  if (0 < pVVar9->nSize) {
    lVar16 = 0;
    do {
      puVar2 = (undefined8 *)pVVar9->pArray[lVar16];
      if (puVar2 != (undefined8 *)0x0) {
        if (((ulong)puVar2 & 1) != 0) goto LAB_00245126;
        if (*(int *)*puVar2 != 3) goto LAB_0024511d;
        if (*(int *)((long)puVar2 + 0x1c) == 2) {
          lVar14 = *(long *)(*(long *)((int *)*puVar2 + 8) + 8);
          pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar2 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar14 + (long)*(int *)puVar2[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar2 + 0x14) >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar14 + (long)((int *)puVar2[4])[1] * 8) + 0x40)
                              ));
          puVar2[8] = pAVar7;
          pVVar9 = pNtk1->vObjs;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar9->nSize);
  }
  iVar5 = Abc_NtkIsDfsOrdered(pNtk2);
  if (iVar5 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcBm.c"
                  ,0x2fc,
                  "Abc_Ntk_t *Abc_NtkMiterBm(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  pVVar9 = pNtk2->vObjs;
  if (0 < pVVar9->nSize) {
    lVar16 = 0;
    do {
      puVar2 = (undefined8 *)pVVar9->pArray[lVar16];
      if (puVar2 != (undefined8 *)0x0) {
        if (((ulong)puVar2 & 1) != 0) goto LAB_00245126;
        if (*(int *)*puVar2 != 3) goto LAB_0024511d;
        if (*(int *)((long)puVar2 + 0x1c) == 2) {
          lVar14 = *(long *)(*(long *)((int *)*puVar2 + 8) + 8);
          pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar2 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar14 + (long)*(int *)puVar2[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar2 + 0x14) >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar14 + (long)((int *)puVar2[4])[1] * 8) + 0x40)
                              ));
          puVar2[8] = pAVar7;
          pVVar9 = pNtk2->vObjs;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar9->nSize);
  }
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  ppvVar10 = (void **)malloc(800);
  pVVar9->pArray = ppvVar10;
  if (oCurrMatch == (Vec_Ptr_t *)0x0) {
    pVVar11 = pNtk1->vCos;
    if (0 < pVVar11->nSize) {
      uVar17 = 100;
      lVar14 = 0;
      lVar16 = 0;
      do {
        plVar3 = *(long **)((long)pVVar11->pArray + lVar16 * 4);
        uVar12 = *(uint *)((long)plVar3 + 0x14);
        uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[4] * 8) + 0x40);
        uVar13 = (uint)lVar16;
        uVar15 = (uint)uVar17;
        if (uVar13 == uVar15) {
          if ((int)uVar15 < 0x10) {
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
            uVar17 = 0x10;
          }
          else {
            uVar17 = (ulong)(uVar15 * 2);
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(uVar17 * 8);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,uVar17 * 8);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar15 * 2;
          }
        }
        else {
          ppvVar10 = pVVar9->pArray;
        }
        pVVar9->nSize = uVar13 + 1;
        ppvVar10[lVar16] = (void *)(uVar12 >> 10 & 1 ^ uVar4);
        if (pNtk2->vCos->nSize <= lVar14) goto LAB_002450fe;
        plVar3 = *(long **)((long)pNtk2->vCos->pArray + lVar16 * 4);
        uVar12 = *(uint *)((long)plVar3 + 0x14);
        uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                    (long)*(int *)plVar3[4] * 8) + 0x40);
        if (uVar13 + 1 == (int)uVar17) {
          if (uVar13 < 0xf) {
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
            uVar17 = 0x10;
          }
          else {
            uVar13 = (int)uVar17 * 2;
            uVar17 = (ulong)uVar13;
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(uVar17 * 8);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,uVar17 * 8);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = uVar13;
          }
        }
        else {
          ppvVar10 = pVVar9->pArray;
        }
        pVVar9->nSize = (int)(lVar16 + 2);
        ppvVar10[lVar16 + 1] = (void *)(uVar12 >> 10 & 1 ^ uVar4);
        lVar14 = lVar14 + 1;
        pVVar11 = pNtk1->vCos;
        lVar16 = lVar16 + 2;
      } while (lVar14 < pVVar11->nSize);
    }
  }
  else if (0 < oCurrMatch->nSize) {
    uVar12 = 0;
    uVar17 = 100;
    lVar16 = 1;
    do {
      plVar3 = (long *)oCurrMatch->pArray[lVar16 + -1];
      uVar13 = *(uint *)((long)plVar3 + 0x14);
      uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)plVar3[4] * 8) + 0x40);
      uVar15 = (uint)uVar17;
      if (uVar12 == uVar15) {
        if ((int)uVar15 < 0x10) {
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = 0x10;
          uVar17 = 0x10;
        }
        else {
          uVar17 = (ulong)(uVar15 * 2);
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(uVar17 * 8);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar9->pArray,uVar17 * 8);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = uVar15 * 2;
        }
      }
      else {
        ppvVar10 = pVVar9->pArray;
      }
      pVVar9->nSize = (int)lVar16;
      ppvVar10[lVar16 + -1] = (void *)(uVar13 >> 10 & 1 ^ uVar4);
      if (oCurrMatch->nSize <= lVar16) goto LAB_002450fe;
      plVar3 = (long *)oCurrMatch->pArray[lVar16];
      uVar13 = *(uint *)((long)plVar3 + 0x14);
      uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)plVar3[4] * 8) + 0x40);
      if ((int)lVar16 == (int)uVar17) {
        if (uVar12 < 0xf) {
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = 0x10;
          uVar17 = 0x10;
        }
        else {
          uVar15 = (int)uVar17 * 2;
          uVar17 = (ulong)uVar15;
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(uVar17 * 8);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar9->pArray,uVar17 * 8);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = uVar15;
        }
      }
      else {
        ppvVar10 = pVVar9->pArray;
      }
      uVar12 = uVar12 + 2;
      pVVar9->nSize = uVar12;
      ppvVar10[lVar16] = (void *)(uVar13 >> 10 & 1 ^ uVar4);
      lVar16 = lVar16 + 2;
    } while ((int)uVar12 < oCurrMatch->nSize);
  }
  pAVar7 = Abc_AigMiter((Abc_Aig_t *)pNtk->pManFunc,pVVar9,0);
  if (0 < pNtk->vPos->nSize) {
    Abc_ObjAddFanin((Abc_Obj_t *)*pNtk->vPos->pArray,pAVar7);
    if (pVVar9->pArray != (void **)0x0) {
      free(pVVar9->pArray);
    }
    free(pVVar9);
    return pNtk;
  }
LAB_002450fe:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
LAB_00245126:
  pcVar6 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_0024512d;
LAB_0024511d:
  pcVar6 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_0024512d:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterBm( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Vec_Ptr_t * iCurrMatch, Vec_Ptr_t * oCurrMatch )
{
	char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;

	pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_%s_miter", pNtk1->pName, pNtk2->pName );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

	//Abc_NtkMiterPrepare( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize );
	{
		Abc_Obj_t * pObj, * pObjNew;
		int i;

		Abc_AigConst1(pNtk1)->pCopy = Abc_AigConst1(pNtkMiter);
		Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtkMiter);

		// create new PIs and remember them in the old PIs
		if(iCurrMatch == NULL)
		{
			Abc_NtkForEachCi( pNtk1, pObj, i )
			{
				pObjNew = Abc_NtkCreatePi( pNtkMiter );
				// remember this PI in the old PIs
				pObj->pCopy = pObjNew;
				pObj = Abc_NtkCi(pNtk2, i);  
				pObj->pCopy = pObjNew;
				// add name
				Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
			}
		}
		else
		{
			for(i = 0; i < Vec_PtrSize( iCurrMatch ); i += 2)
			{
				pObjNew = Abc_NtkCreatePi( pNtkMiter );
				pObj = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch, i);
				pObj->pCopy = pObjNew;
				pObj = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch, i+1);
				pObj->pCopy = pObjNew;
				// add name
				Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
			}
		}

        // create the only PO
        pObjNew = Abc_NtkCreatePo( pNtkMiter );
        // add the PO name
        Abc_ObjAssignName( pObjNew, "miter", NULL );
	}

	// Abc_NtkMiterAddOne( pNtk1, pNtkMiter );
	{
		Abc_Obj_t * pNode;
		int i;
		assert( Abc_NtkIsDfsOrdered(pNtk1) );
		Abc_AigForEachAnd( pNtk1, pNode, i )
			pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
	}

	// Abc_NtkMiterAddOne( pNtk2, pNtkMiter );
	{
		Abc_Obj_t * pNode;
		int i;
		assert( Abc_NtkIsDfsOrdered(pNtk2) );
		Abc_AigForEachAnd( pNtk2, pNode, i )
			pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
	}
	
	// Abc_NtkMiterFinalize( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize );	
	{
		Vec_Ptr_t * vPairs;
		Abc_Obj_t * pMiter;
		int i;

		vPairs = Vec_PtrAlloc( 100 );
	    
		// collect the CO nodes for the miter
		if(oCurrMatch != NULL)
		{
			for(i = 0; i < Vec_PtrSize( oCurrMatch ); i += 2)
			{
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oCurrMatch, i)) );
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oCurrMatch, i+1)) );
			}
		}
		else
		{
			Abc_Obj_t * pNode;

			Abc_NtkForEachCo( pNtk1, pNode, i )
			{
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
				pNode = Abc_NtkCo( pNtk2, i );
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
			}
		}
		
	 pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkMiter->pManFunc, vPairs, 0 );
	 Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );
	 Vec_PtrFree(vPairs);
	}

	//Abc_AigCleanup(pNtkMiter->pManFunc);
	
	return pNtkMiter;
}